

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::ValidateToken
          (Error *__return_storage_ptr__,TokenManager *this,CborMap *aToken,ByteArray *aSignedToken,
          mbedtls_pk_context_conflict *aPublicKey)

{
  char cVar1;
  ErrorCode EVar2;
  bool bVar3;
  Error *pEVar4;
  uint8_t *aBuf;
  char *pcVar5;
  char *pcVar6;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_128 [8];
  _Alloc_hider _Stack_120;
  undefined1 local_118 [24];
  parse_func local_100 [1];
  code *local_f8;
  string local_e8;
  size_t domainNameLength;
  char *domainName;
  Sign1Message coseSign;
  writer write;
  char *pcStack_a0;
  size_t payloadLength;
  CborMap token;
  undefined1 local_68 [40];
  size_t expireLength;
  char *expire;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  cose::Sign1Message::Sign1Message(&coseSign);
  CborMap::CborMap(&token);
  if ((aSignedToken->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (aSignedToken->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
    _Stack_120._M_p = "the signed COM_TOK is empty";
    local_118._0_8_ = (pointer)0x1b;
    local_118._8_8_ = 0;
    local_100[0] = (parse_func)0x0;
    pcVar5 = "the signed COM_TOK is empty";
    local_118._16_8_ = local_128;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_128);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_128;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e8,(v10 *)"the signed COM_TOK is empty",(string_view)ZEXT816(0x1b),args);
    local_68._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_e8);
LAB_00197dab:
    Error::operator=(__return_storage_ptr__,(Error *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    this_00 = &local_e8;
  }
  else {
    cose::Sign1Message::Deserialize((Error *)local_128,&coseSign,aSignedToken);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_128);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&_Stack_120);
    if (EVar2 != kNone) goto LAB_00197dcd;
    cose::Sign1Message::Validate((Error *)local_128,&coseSign,(mbedtls_pk_context *)aPublicKey);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_128);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&_Stack_120);
    if (EVar2 != kNone) goto LAB_00197dcd;
    aBuf = cose::Sign1Message::GetPayload(&coseSign,&payloadLength);
    if (aBuf == (uint8_t *)0x0) {
      local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
      _Stack_120._M_p = "cannot find payload in the signed COM_TOK";
      local_118._0_8_ = (pointer)0x29;
      local_118._8_8_ = 0;
      local_100[0] = (parse_func)0x0;
      pcVar5 = "cannot find payload in the signed COM_TOK";
      local_118._16_8_ = local_128;
      write.handler_ = (format_string_checker<char> *)local_128;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar5,"");
            goto LAB_00197e8f;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_128);
      }
LAB_00197e8f:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_128;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e8,(v10 *)"cannot find payload in the signed COM_TOK",
                 (string_view)ZEXT816(0x29),args_00);
      local_68._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_e8);
      goto LAB_00197dab;
    }
    CborValue::Deserialize((Error *)local_128,&token.super_CborValue,aBuf,payloadLength);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_128);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&_Stack_120);
    if (EVar2 != kNone) goto LAB_00197dcd;
    CborMap::Get((Error *)local_128,&token,3,&domainName,&domainNameLength);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_128);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&_Stack_120);
    if (EVar2 != kNone) goto LAB_00197dcd;
    CborMap::Get((Error *)local_128,&token,4,&expire,&expireLength);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_128);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&_Stack_120);
    if (EVar2 != kNone) goto LAB_00197dcd;
    local_128 = (undefined1  [8])local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,domainName,domainName + domainNameLength);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_128,&this->mDomainName);
    std::__cxx11::string::~string((string *)local_128);
    if (!bVar3) {
      CborValue::Move(&aToken->super_CborValue,&token.super_CborValue);
      goto LAB_00197dcd;
    }
    local_128 = (undefined1  [8])0xd0000000d;
    _Stack_120._M_p =
         "the Domain Name ({}) in COM_TOK doesn\'t match the configured Domain Name ({})";
    local_118._0_8_ = 0x4d;
    local_118._8_8_ = 0x200000000;
    local_100[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_f8 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar5 = "the Domain Name ({}) in COM_TOK doesn\'t match the configured Domain Name ({})";
    local_118._16_8_ = local_128;
    write.handler_ = (format_string_checker<char> *)local_128;
    while (pcVar5 != "") {
      cVar1 = *pcVar5;
      pcVar6 = pcVar5;
      while (cVar1 != '{') {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&write,pcVar5,"");
          goto LAB_00197ef6;
        }
        cVar1 = *pcVar6;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)&write,pcVar5,pcVar6);
      pcVar5 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                         (pcVar6,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_128);
    }
LAB_00197ef6:
    write.handler_ = (format_string_checker<char> *)&stack0xffffffffffffff68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&write,domainName,domainName + domainNameLength);
    local_118._0_8_ = (this->mDomainName)._M_dataplus._M_p;
    local_118._8_8_ = (this->mDomainName)._M_string_length;
    local_128 = (undefined1  [8])write.handler_;
    _Stack_120._M_p = pcStack_a0;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x4d;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_128;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e8,
               (v10 *)
               "the Domain Name ({}) in COM_TOK doesn\'t match the configured Domain Name ({})",fmt,
               args_01);
    local_68._0_4_ = kSecurity;
    std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_e8);
    Error::operator=(__return_storage_ptr__,(Error *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    std::__cxx11::string::~string((string *)&local_e8);
    this_00 = (string *)&write;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00197dcd:
  CborValue::Free(&token.super_CborValue);
  cose::Sign1Message::Free(&coseSign);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ValidateToken(CborMap                  &aToken,
                                  const ByteArray          &aSignedToken,
                                  const mbedtls_pk_context &aPublicKey) const
{
    Error              error;
    cose::Sign1Message coseSign;
    CborMap            token;
    const uint8_t     *payload;
    size_t             payloadLength;
    const char        *domainName;
    size_t             domainNameLength;
    const char        *expire;
    size_t             expireLength;

    VerifyOrExit(!aSignedToken.empty(), error = ERROR_INVALID_ARGS("the signed COM_TOK is empty"));
    SuccessOrExit(error = cose::Sign1Message::Deserialize(coseSign, aSignedToken));

    SuccessOrExit(error = coseSign.Validate(aPublicKey));

    VerifyOrExit((payload = coseSign.GetPayload(payloadLength)) != nullptr,
                 error = ERROR_BAD_FORMAT("cannot find payload in the signed COM_TOK"));

    SuccessOrExit(error = CborValue::Deserialize(token, payload, payloadLength));

    SuccessOrExit(error = token.Get(cwt::kAud, domainName, domainNameLength));

    SuccessOrExit(error = token.Get(cwt::kExp, expire, expireLength));

    // TODO(wgtdkp): make sure it is not expired

    // Ignore the "iss" (issuer) claim

    if (std::string{domainName, domainNameLength} != mDomainName)
    {
        ExitNow(error = ERROR_SECURITY("the Domain Name ({}) in COM_TOK doesn't match the configured Domain Name ({})",
                                       std::string{domainName, domainNameLength}, mDomainName));
    }

    CborValue::Move(aToken, token);

exit:
    token.Free();
    coseSign.Free();
    return error;
}